

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampSamplingTexture.cpp
# Opt level: O0

IterateResult __thiscall
glcts::TextureBorderClampSamplingTexture<int,_int>::iterate
          (TextureBorderClampSamplingTexture<int,_int> *this)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  GLint GVar6;
  GLenum GVar7;
  undefined4 uVar8;
  GLuint GVar9;
  GLuint GVar10;
  RenderContext *pRVar11;
  undefined4 extraout_var;
  TestError *pTVar13;
  TestConfiguration<int,_int> *this_00;
  int local_90;
  int expectedColor;
  GLint layerLocation;
  GLint i;
  int local_78;
  int local_74;
  GLint border_color_2 [4];
  GLuint local_58;
  GLint val_2;
  GLuint border_color_1 [4];
  float local_38;
  GLuint val_1;
  GLfloat border_color [4];
  GLfloat val;
  GLint samplerLocation;
  bool testResult;
  Functions *gl;
  TextureBorderClampSamplingTexture<int,_int> *this_local;
  long lVar12;
  
  initTest(this);
  pRVar11 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar4 = (*pRVar11->_vptr_RenderContext[3])();
  lVar12 = CONCAT44(extraout_var,iVar4);
  bVar2 = true;
  (**(code **)(lVar12 + 0x1680))(this->m_po_id);
  dVar5 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar5,"Error using program!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x192);
  (**(code **)(lVar12 + 0x40))(0x8892,this->m_position_vbo_id);
  dVar5 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar5,"Could not bind buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x196);
  GVar6 = (**(code **)(lVar12 + 0x780))(this->m_po_id,"vertex_position_in");
  this->m_attr_position_location = GVar6;
  dVar5 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar5,"Could not get attribute location!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x199);
  (**(code **)(lVar12 + 0x19f0))(this->m_attr_position_location,4,0x1406,0);
  dVar5 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar5,"Could not set vertex attribute pointer!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x19c);
  (**(code **)(lVar12 + 0x610))(this->m_attr_position_location);
  dVar5 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar5,"Could not enable vertex attribute array!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x19f);
  (**(code **)(lVar12 + 0x40))(0x8892,this->m_text_coord_vbo_id);
  dVar5 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar5,"Could not bind buffer object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1a3);
  GVar6 = (**(code **)(lVar12 + 0x780))(this->m_po_id,"texture_coords_in");
  this->m_attr_texcoord_location = GVar6;
  dVar5 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar5,"Could not get attribute location!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1a6);
  (**(code **)(lVar12 + 0x19f0))(this->m_attr_texcoord_location,2,0x1406,0,0,0);
  dVar5 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar5,"Could not set vertex attribute pointer!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1a9);
  (**(code **)(lVar12 + 0x610))(this->m_attr_texcoord_location);
  dVar5 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar5,"Could not enable vertex attribute array!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1ac);
  (**(code **)(lVar12 + 8))(0x84c0);
  dVar5 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar5,"Error setting active texture unit!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1b0);
  pcVar1 = *(code **)(lVar12 + 0xb8);
  GVar7 = TestConfiguration<int,_int>::get_target(&this->m_test_configuration);
  (*pcVar1)(GVar7,this->m_input_to_id);
  dVar5 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar5,"Error binding texture!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1b3);
  uVar8 = (**(code **)(lVar12 + 0xb48))(this->m_po_id,"test_sampler");
  dVar5 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar5,"Erros getting sampler location!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1b6);
  (**(code **)(lVar12 + 0x14f0))(uVar8,0);
  dVar5 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar5,"Could not bind sampler location to texture unit!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1b9);
  (**(code **)(lVar12 + 0xa8))(0,this->m_sampler_id);
  dVar5 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar5,"Could not bind sampler object to texture unit!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1bc);
  GVar7 = TestConfiguration<int,_int>::get_input_internal_format(&this->m_test_configuration);
  if ((GVar7 != 0x8058) && (GVar7 != 0x81a5)) {
    if (GVar7 == 0x8235) {
      local_78 = TestConfiguration<int,_int>::get_init_border_color(&this->m_test_configuration);
      local_74 = local_78;
      border_color_2[0] = local_78;
      border_color_2[1] = local_78;
      (**(code **)(lVar12 + 0x1260))
                (this->m_sampler_id,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BORDER_COLOR,
                 &local_78);
      goto LAB_0155bb74;
    }
    if (GVar7 == 0x8236) {
      local_58 = TestConfiguration<int,_int>::get_init_border_color(&this->m_test_configuration);
      val_2 = local_58;
      border_color_1[0] = local_58;
      border_color_1[1] = local_58;
      (**(code **)(lVar12 + 0x1268))
                (this->m_sampler_id,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BORDER_COLOR,
                 &local_58);
      goto LAB_0155bb74;
    }
    if (((GVar7 != 0x8814) && (GVar7 != 0x8cac)) && (GVar7 != 0x9278)) {
      pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar13,"Unsupported sized internal format. Should never happen!","",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                 ,0x1dc);
      __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  iVar4 = TestConfiguration<int,_int>::get_init_border_color(&this->m_test_configuration);
  local_38 = (float)iVar4;
  val_1 = (GLuint)local_38;
  border_color[0] = local_38;
  border_color[1] = local_38;
  border_color[3] = local_38;
  (**(code **)(lVar12 + 0x1278))
            (this->m_sampler_id,(this->super_TestCaseBase).m_glExtTokens.TEXTURE_BORDER_COLOR,
             &local_38);
LAB_0155bb74:
  dVar5 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar5,"Error setting border color parameter!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1df);
  (**(code **)(lVar12 + 0x1280))
            (this->m_sampler_id,0x2802,(this->super_TestCaseBase).m_glExtTokens.CLAMP_TO_BORDER);
  dVar5 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar5,"Error setting GL_TEXTURE_WRAP_S parameter!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1e3);
  (**(code **)(lVar12 + 0x1280))
            (this->m_sampler_id,0x8072,(this->super_TestCaseBase).m_glExtTokens.CLAMP_TO_BORDER);
  dVar5 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar5,"Error setting GL_TEXTURE_WRAP_R parameter!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1e5);
  (**(code **)(lVar12 + 0x1280))
            (this->m_sampler_id,0x2803,(this->super_TestCaseBase).m_glExtTokens.CLAMP_TO_BORDER);
  dVar5 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar5,"Error setting GL_TEXTURE_WRAP_T parameter!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1e7);
  pcVar1 = *(code **)(lVar12 + 0x1280);
  GVar9 = this->m_sampler_id;
  GVar7 = TestConfiguration<int,_int>::get_filtering(&this->m_test_configuration);
  (*pcVar1)(GVar9,0x2800,GVar7);
  dVar5 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar5,"Error setting value for GL_TEXTURE_MAG_FILTER parameter!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1eb);
  pcVar1 = *(code **)(lVar12 + 0x1280);
  GVar9 = this->m_sampler_id;
  GVar7 = TestConfiguration<int,_int>::get_filtering(&this->m_test_configuration);
  (*pcVar1)(GVar9,0x2801,GVar7);
  dVar5 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar5,"Error setting value for GL_TEXTURE_MIN_FILTER parameter!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                  ,0x1ed);
  expectedColor = getStartingLayerIndex(this);
  do {
    GVar6 = getLastLayerIndex(this);
    if (GVar6 <= expectedColor) {
      if (bVar2) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
      }
      return STOP;
    }
    uVar8 = (**(code **)(lVar12 + 0xb48))(this->m_po_id,"layer");
    dVar5 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar5,"Error getting layer uniform location!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                    ,499);
    pcVar1 = *(code **)(lVar12 + 0x14e0);
    getCoordinateValue(this,expectedColor);
    (*pcVar1)(uVar8);
    dVar5 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar5,"Error setting layer uniform variable!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                    ,0x1f6);
    (**(code **)(lVar12 + 0x78))(0x8ca9,this->m_fbo_id);
    dVar5 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar5,"Error binding framebuffer object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                    ,0x1fa);
    pcVar1 = *(code **)(lVar12 + 0x1a00);
    this_00 = &this->m_test_configuration;
    GVar9 = TestConfiguration<int,_int>::get_width(this_00);
    GVar10 = TestConfiguration<int,_int>::get_height(this_00);
    (*pcVar1)(0,0,GVar9,GVar10);
    dVar5 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar5,"Error setting view port!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                    ,0x201);
    (**(code **)(lVar12 + 0x6a0))(0x8ca9,0x8ce0,0xde1,this->m_output_to_id,0);
    dVar5 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar5,"Could not attach texture object to GL_COLOR_ATTACHMENT0!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                    ,0x209);
    checkFramebufferStatus(this,0x8ca9);
    (**(code **)(lVar12 + 0x188))(0x4000);
    dVar5 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar5,"Error clearing color buffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                    ,0x210);
    (**(code **)(lVar12 + 0x538))(5,0,4);
    dVar5 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar5,"Rendering failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                    ,0x214);
    GVar7 = TestConfiguration<int,_int>::get_target(this_00);
    if (GVar7 == 0xde1) {
LAB_0155c024:
      local_90 = TestConfiguration<int,_int>::get_expected_value(&this->m_test_configuration);
    }
    else {
      if (GVar7 != 0x806f) {
        if (GVar7 != 0x8c1a) {
          pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar13,
                     "Not allowed texture target - should be one of GL_TEXTURE_2D, GL_TEXTURE_2D_ARRAY, GL_TEXTURE_3D"
                     ,(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                     ,0x22a);
          __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        goto LAB_0155c024;
      }
      if ((expectedColor < 0) ||
         (GVar9 = TestConfiguration<int,_int>::get_depth(&this->m_test_configuration),
         (int)GVar9 <= expectedColor)) {
        local_90 = TestConfiguration<int,_int>::get_expected_border_color
                             (&this->m_test_configuration);
      }
      else {
        local_90 = TestConfiguration<int,_int>::get_expected_value(&this->m_test_configuration);
      }
    }
    iVar4 = TestConfiguration<int,_int>::get_expected_border_color(&this->m_test_configuration);
    bVar3 = checkResult(this,local_90,iVar4,expectedColor);
    if (!bVar3) {
      bVar2 = false;
    }
    expectedColor = expectedColor + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult TextureBorderClampSamplingTexture<InputType, OutputType>::iterate(void)
{
	/* Initialize test case */
	initTest();

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	bool testResult = true;

	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error using program!");

	/* Configure vertices position attribute */
	gl.bindBuffer(GL_ARRAY_BUFFER, m_position_vbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind buffer object!");

	m_attr_position_location = gl.getAttribLocation(m_po_id, "vertex_position_in");
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not get attribute location!");

	gl.vertexAttribPointer(m_attr_position_location, 4, GL_FLOAT, GL_FALSE, 0, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set vertex attribute pointer!");

	gl.enableVertexAttribArray(m_attr_position_location);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not enable vertex attribute array!");

	/* Configure texture coordinates attribute */
	gl.bindBuffer(GL_ARRAY_BUFFER, m_text_coord_vbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind buffer object!");

	m_attr_texcoord_location = gl.getAttribLocation(m_po_id, "texture_coords_in");
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not get attribute location!");

	gl.vertexAttribPointer(m_attr_texcoord_location, 2, GL_FLOAT, GL_FALSE, 0, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set vertex attribute pointer!");

	gl.enableVertexAttribArray(m_attr_texcoord_location);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not enable vertex attribute array!");

	/* Configure and bind sampler to texture unit */
	gl.activeTexture(GL_TEXTURE0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting active texture unit!");

	gl.bindTexture(m_test_configuration.get_target(), m_input_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture!");

	glw::GLint samplerLocation = gl.getUniformLocation(m_po_id, "test_sampler");
	GLU_EXPECT_NO_ERROR(gl.getError(), "Erros getting sampler location!");

	gl.uniform1i(samplerLocation, m_texture_unit);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind sampler location to texture unit!");

	gl.bindSampler(m_texture_unit, m_sampler_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind sampler object to texture unit!");

	/* Set GL_TEXTURE_BORDER_COLOR_EXT for sampler object */
	switch (m_test_configuration.get_input_internal_format())
	{
	case GL_RGBA32F:
	case GL_RGBA8:
	case GL_DEPTH_COMPONENT32F:
	case GL_DEPTH_COMPONENT16:
	case GL_COMPRESSED_RGBA8_ETC2_EAC:
	{
		glw::GLfloat val			= (glw::GLfloat)m_test_configuration.get_init_border_color();
		glw::GLfloat border_color[] = { val, val, val, val };
		gl.samplerParameterfv(m_sampler_id, m_glExtTokens.TEXTURE_BORDER_COLOR, border_color);
		break;
	}
	case GL_R32UI:
	{
		glw::GLuint val			   = (glw::GLuint)m_test_configuration.get_init_border_color();
		glw::GLuint border_color[] = { val, val, val, val };
		gl.samplerParameterIuiv(m_sampler_id, m_glExtTokens.TEXTURE_BORDER_COLOR, border_color);
		break;
	}
	case GL_R32I:
	{
		glw::GLint val			  = (glw::GLint)m_test_configuration.get_init_border_color();
		glw::GLint border_color[] = { val, val, val, val };
		gl.samplerParameterIiv(m_sampler_id, m_glExtTokens.TEXTURE_BORDER_COLOR, border_color);
		break;
	}

	default:
		throw tcu::TestError("Unsupported sized internal format. Should never happen!", "", __FILE__, __LINE__);
		break;
	};
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting border color parameter!");

	/* Set sampler's GL_TEXTURE_WRAP_* parameters values to GL_CLAMP_TO_BORDER_EXT */
	gl.samplerParameteri(m_sampler_id, GL_TEXTURE_WRAP_S, m_glExtTokens.CLAMP_TO_BORDER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting GL_TEXTURE_WRAP_S parameter!");
	gl.samplerParameteri(m_sampler_id, GL_TEXTURE_WRAP_R, m_glExtTokens.CLAMP_TO_BORDER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting GL_TEXTURE_WRAP_R parameter!");
	gl.samplerParameteri(m_sampler_id, GL_TEXTURE_WRAP_T, m_glExtTokens.CLAMP_TO_BORDER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting GL_TEXTURE_WRAP_T parameter!");

	/* Set GL_TEXTURE_MAG_FILTER and GL_TEXTURE_MIN_FILTER parameters values */
	gl.samplerParameteri(m_sampler_id, GL_TEXTURE_MAG_FILTER, m_test_configuration.get_filtering());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting value for GL_TEXTURE_MAG_FILTER parameter!");
	gl.samplerParameteri(m_sampler_id, GL_TEXTURE_MIN_FILTER, m_test_configuration.get_filtering());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting value for GL_TEXTURE_MIN_FILTER parameter!");

	for (glw::GLint i = getStartingLayerIndex(); i < getLastLayerIndex(); ++i)
	{
		/* Configure layer (third texture coordinate) */
		glw::GLint layerLocation = gl.getUniformLocation(m_po_id, "layer");
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting layer uniform location!");

		gl.uniform1f(layerLocation, getCoordinateValue(i));
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting layer uniform variable!");

		/* Bind framebuffer object */
		gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_fbo_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding framebuffer object!");

		/* Set view port */
		gl.viewport(0,									/* x */
					0,									/* y */
					m_test_configuration.get_width(),   /* width */
					m_test_configuration.get_height()); /* height */
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting view port!");

		/* Attach texture to framebuffer */
		gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER,  /* target */
								GL_COLOR_ATTACHMENT0, /* attachment */
								GL_TEXTURE_2D,		  /* textarget */
								m_output_to_id,		  /* texture */
								0);					  /* level */
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not attach texture object to GL_COLOR_ATTACHMENT0!");

		/* Check framebuffer status */
		checkFramebufferStatus(GL_DRAW_FRAMEBUFFER);

		/* Clear the color buffer with (0.5, 0.5, 0.5, 1) color */
		gl.clear(GL_COLOR_BUFFER_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error clearing color buffer");

		/* Render */
		gl.drawArrays(GL_TRIANGLE_STRIP, 0, 4);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Rendering failed!");

		/* Get data from framebuffer's color attachment and compare with expected values.
		 * For GL_NEAREST filtering and GL_TEXTURE_3D texture target and Layer equal to
		 * -1 or Depth the whole texture is expected to be filled with border color
		 */
		OutputType expectedColor;

		switch (m_test_configuration.get_target())
		{
		case GL_TEXTURE_2D:
		case GL_TEXTURE_2D_ARRAY:
			expectedColor = m_test_configuration.get_expected_value();
			break;

		case GL_TEXTURE_3D:
			if (i > -1 && i < (glw::GLint)m_test_configuration.get_depth())
				expectedColor = m_test_configuration.get_expected_value();
			else
				expectedColor = m_test_configuration.get_expected_border_color();
			break;
		default:
			TCU_FAIL("Not allowed texture target - should be one of GL_TEXTURE_2D, GL_TEXTURE_2D_ARRAY, GL_TEXTURE_3D");
		}

		if (!checkResult(expectedColor, m_test_configuration.get_expected_border_color(), i))
		{
			testResult = false;
		}
	}

	if (testResult)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}
	return STOP;
}